

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O0

float __thiscall LumaQuantizer::quantize(LumaQuantizer *this,float val,uint ch)

{
  float *pfVar1;
  uint uVar2;
  undefined4 in_XMM0_Db;
  double dVar3;
  float local_30;
  float local_2c [2];
  uint local_24;
  int m;
  int r;
  int l;
  float res;
  uint ch_local;
  float val_local;
  LumaQuantizer *this_local;
  
  if (((ch == 0) || (this->m_colorSpace == CS_RGB)) || (this->m_colorSpace == CS_XYZ)) {
    m = 0;
    local_24 = this->m_maxVal;
    uVar2 = m;
    while (m = uVar2, m + 1 < (int)local_24) {
      uVar2 = (int)(m + local_24) / 2;
      if (val < this->m_mapping[(int)uVar2]) {
        local_24 = uVar2;
        uVar2 = m;
      }
    }
    if (val - this->m_mapping[m] < this->m_mapping[(int)local_24] - val) {
      local_24 = m;
    }
    r = (int)(float)(int)local_24;
  }
  else {
    l = ch;
    res = val;
    _ch_local = this;
    dVar3 = std::floor((double)CONCAT44(in_XMM0_Db,(float)this->m_maxValColor * val + 0.5));
    r = SUB84(dVar3,0);
    local_2c[0] = 0.0;
    local_30 = (float)this->m_maxValColor;
    pfVar1 = std::min<float>(&local_30,(float *)&r);
    pfVar1 = std::max<float>(local_2c,pfVar1);
    r = (int)*pfVar1;
  }
  return (float)r;
}

Assistant:

float LumaQuantizer::quantize(const float val, const unsigned int ch) const
{
    float res;
    
	if (ch == 0 || m_colorSpace == CS_RGB || m_colorSpace == CS_XYZ)
    {
	    //binary search for best fitting luminance
	    int l = 0, r = m_maxVal;
	    while( l+1 < r )
	    {
		    int m = (l+r)/2;
		    if( val < m_mapping[m] )
			    r = m;
		    else
			    l = m;
	    }
	    //assert( r - l == 1 );
	    if ( val - m_mapping[l] < m_mapping[r] - val )
		    res = (float)l;
	    else
		    res = (float)r;
	}
	else
	{
	    res = floor(m_maxValColor*val + 0.5f);
        res = std::max(0.0f, std::min((float)m_maxValColor, res));
    }
	
	return res;
}